

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

string * __thiscall
dmlc::JSONReader::line_info_abi_cxx11_(string *__return_storage_ptr__,JSONReader *this)

{
  ostream *poVar1;
  unsigned_long *puVar2;
  ostringstream local_1d0 [8];
  ostringstream os;
  char local_58 [8];
  char temp [64];
  JSONReader *this_local;
  
  temp._56_8_ = this;
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  poVar1 = std::operator<<((ostream *)local_1d0," Line ");
  puVar2 = std::max<unsigned_long>(&this->line_count_r_,&this->line_count_n_);
  std::ostream::operator<<(poVar1,*puVar2);
  std::istream::getline((char *)this->is_,(long)local_58);
  poVar1 = std::operator<<((ostream *)local_1d0,", around ^`");
  poVar1 = std::operator<<(poVar1,local_58);
  std::operator<<(poVar1,"`");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string line_info() const {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
    char temp[64];
    std::ostringstream os;
    os << " Line " << std::max(line_count_r_, line_count_n_);
    is_->getline(temp, 64);
    os << ", around ^`" << temp << "`";
    return os.str();
#else
    std::string info = " Line ";
    info += std::to_string(std::max(line_count_r_, line_count_n_));

    // string getline
    size_t end_pos = is_->find('\n');
    end_pos = std::min((size_t)64,
                       end_pos == std::string::npos ? is_->size() : end_pos);
    std::string line = is_->substr(0, end_pos);
    is_->erase(0, line.size() + 1); // +1 for \n

    info += ", around ^`" + line + "`";
    return info;
#endif
  }